

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.cpp
# Opt level: O3

bool __thiscall GCSFilter::MatchInternal(GCSFilter *this,uint64_t *element_hashes,size_t size)

{
  ulong uVar1;
  uint64_t uVar2;
  ulong uVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  bool bVar7;
  BitStreamReader<SpanReader> bitreader;
  SpanReader stream;
  BitStreamReader<SpanReader> local_58;
  SpanReader local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.m_data.m_data =
       (this->m_encoded).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48.m_data.m_size =
       (long)(this->m_encoded).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)local_48.m_data.m_data;
  uVar2 = ReadCompactSize<SpanReader>(&local_48,true);
  uVar3 = (ulong)this->m_N;
  if (uVar2 != uVar3) {
    __assert_fail("N == m_N",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/blockfilter.cpp"
                  ,0x6d,"bool GCSFilter::MatchInternal(const uint64_t *, size_t) const");
  }
  local_58.m_buffer = '\0';
  local_58.m_offset = 8;
  local_58.m_istream = &local_48;
  if (this->m_N == 0) {
    bVar7 = false;
  }
  else {
    uVar4 = 0;
    sVar5 = 0;
    uVar6 = 0;
    do {
      uVar2 = GolombRiceDecode<SpanReader>(&local_58,(this->m_params).m_P);
      bVar7 = sVar5 == size;
      if (bVar7) {
        uVar3 = 0;
LAB_0044e3a2:
        bVar7 = true;
        break;
      }
      uVar6 = uVar6 + uVar2;
      while( true ) {
        uVar1 = element_hashes[sVar5];
        uVar3 = (ulong)(uVar1 == uVar6);
        if (uVar1 == uVar6) goto LAB_0044e3a2;
        if (uVar6 < uVar1) break;
        sVar5 = sVar5 + 1;
        if (size == sVar5) goto LAB_0044e3a2;
      }
      uVar4 = uVar4 + 1;
      uVar3 = 0;
    } while (uVar4 < this->m_N);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)(bVar7 & (byte)uVar3);
}

Assistant:

bool GCSFilter::MatchInternal(const uint64_t* element_hashes, size_t size) const
{
    SpanReader stream{m_encoded};

    // Seek forward by size of N
    uint64_t N = ReadCompactSize(stream);
    assert(N == m_N);

    BitStreamReader bitreader{stream};

    uint64_t value = 0;
    size_t hashes_index = 0;
    for (uint32_t i = 0; i < m_N; ++i) {
        uint64_t delta = GolombRiceDecode(bitreader, m_params.m_P);
        value += delta;

        while (true) {
            if (hashes_index == size) {
                return false;
            } else if (element_hashes[hashes_index] == value) {
                return true;
            } else if (element_hashes[hashes_index] > value) {
                break;
            }

            hashes_index++;
        }
    }

    return false;
}